

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

string * Path::join(string *__return_storage_ptr__,string *base,string *path)

{
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  char *local_38;
  undefined1 local_29;
  undefined1 auStack_28 [7];
  bool need_slash;
  size_t index;
  string *path_local;
  string *base_local;
  
  index = (size_t)path;
  path_local = base;
  base_local = __return_storage_ptr__;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      bVar1 = is_abspath((string *)index);
      if (bVar1) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)index);
      }
      else {
        sVar3 = find_last_slash(path_local);
        _auStack_28 = sVar3;
        lVar4 = std::__cxx11::string::size();
        local_29 = sVar3 != lVar4 - 1U;
        local_38 = "";
        if ((bool)local_29) {
          local_38 = "/";
        }
        Util::join<std::__cxx11::string_const&,char_const*,std::__cxx11::string_const&>
                  (__return_storage_ptr__,(Util *)path_local,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38,
                   (char **)index,in_R8);
      }
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path_local);
    }
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)index);
  }
  return __return_storage_ptr__;
}

Assistant:

string join(const string &base, const string &path)
{
	if (base.empty())
		return path;
	if (path.empty())
		return base;

	if (is_abspath(path))
		return path;

	auto index = find_last_slash(base);
	bool need_slash = index != base.size() - 1;
	return Util::join(base, need_slash ? "/" : "", path);
}